

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O1

int __thiscall GrcFont::ReadData(GrcFont *this,byte **ppData,ptrdiff_t lnOffset,size_t lnSize)

{
  int iVar1;
  byte *pbVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string local_60;
  string local_40;
  
  pbVar2 = (byte *)operator_new__(lnSize);
  *ppData = pbVar2;
  iVar1 = fseek((FILE *)this->m_pFile,lnOffset,0);
  if (iVar1 == 0) {
    sVar3 = fread(*ppData,lnSize,1,(FILE *)this->m_pFile);
    if (sVar3 == 1) {
      return 1;
    }
    paVar5 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Could not read requested data from font file","");
    GrcErrorList::AddError(&g_errorList,0x7f,(GdlObject *)0x0,&local_60);
    _Var4._M_p = local_60._M_dataplus._M_p;
  }
  else {
    paVar5 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Could not seek to correct place in font file","");
    GrcErrorList::AddError(&g_errorList,0x7e,(GdlObject *)0x0,&local_40);
    _Var4._M_p = local_40._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar5) {
    operator_delete(_Var4._M_p,paVar5->_M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int GrcFont::ReadData(gr::byte ** ppData, ptrdiff_t lnOffset, size_t lnSize)
{
	*ppData = new gr::byte[lnSize];
	if (!*ppData)
	{
		g_errorList.AddError(125, NULL, 
			"Memory failure: could not allocate ppData array while reading font file");
		return false;
	}
	if (fseek(m_pFile, long(lnOffset), SEEK_SET))
	{
		g_errorList.AddError(126, NULL, 
			"Could not seek to correct place in font file");
		return false;
	}
	if (fread(*ppData, lnSize, 1, m_pFile) != 1)
	{
		g_errorList.AddError(127, NULL, 
			"Could not read requested data from font file");
		return false;
	}
	return true;
}